

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

void __thiscall
Lodtalk::StackInterpreter::interpretPrimitive(StackInterpreter *this,int primitiveIndex)

{
  PrimitiveFunction p_Var1;
  InterpreterProxy local_20;
  StackInterpreter *local_18;
  
  if (primitiveIndex == 0x100) {
    puts("TODO: Find the named primitive");
    return;
  }
  p_Var1 = VMContext::findPrimitive(this->context,primitiveIndex);
  if (p_Var1 != (PrimitiveFunction)0x0) {
    local_20._vptr_InterpreterProxy = (_func_int **)&PTR_getContext_001645e0;
    this->primitiveHasFailed = false;
    local_18 = this;
    (*p_Var1)(&local_20);
    if (this->primitiveHasFailed == true) {
      *(long *)((this->stack->stackFrame).framePointer + -0x28) =
           (long)this->primitiveErrorCode * 2 + 1;
    }
    return;
  }
  printf("unimplemented primitive: %d\n",(ulong)(uint)primitiveIndex);
  return;
}

Assistant:

void interpretPrimitive(int primitiveIndex)
    {
        // Use a switch for the fast primitives.
        switch(primitiveIndex)
        {
        case 256:
            return findAndCallNamedPrimitive();
        default:
            // Go through the slow route.
            break;
        }

        // Call the normal primitive
        auto primitive = context->findPrimitive(primitiveIndex);
        if(primitive)
        {
            return callPrimitiveHere(primitive);
        }

        printf("unimplemented primitive: %d\n", primitiveIndex);
    }